

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::PrefixedExpr(SQParser *this)

{
  Arena *this_00;
  SQInteger SVar1;
  SQInteger SVar2;
  Expr **ppEVar3;
  CallExpr *pCVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  CallExpr *pCVar9;
  Expr *pEVar10;
  Chunk *pCVar11;
  char *pcVar12;
  int iVar13;
  SQInteger *in_RSI;
  bool bVar14;
  long lVar15;
  
  uVar7 = this->_depth;
  if (500 < uVar7) {
    in_RSI = (SQInteger *)0x1d;
    reportDiagnostic(this,0x1d);
    uVar7 = this->_depth;
  }
  this->_depth = uVar7 + 1;
  pCVar9 = (CallExpr *)Factor(this,in_RSI);
  iVar13 = 1;
  bVar14 = false;
  do {
    while( true ) {
      uVar7 = this->_depth;
      if (500 < uVar7) {
        reportDiagnostic(this,0x1d);
        uVar7 = this->_depth;
      }
      uVar8 = uVar7 + 1;
      this->_depth = uVar8;
      iVar13 = iVar13 + 1;
      lVar15 = this->_token;
      if (lVar15 < 0x147) break;
      if (lVar15 < 0x155) {
        if (lVar15 == 0x147) {
LAB_0016250f:
          bVar14 = true;
          goto LAB_00162512;
        }
        if (lVar15 != 0x149) goto LAB_00162721;
LAB_001623cd:
        if ((lVar15 == 0x28) && (((this->_lex)._prevflags & 1) != 0)) {
          reportDiagnostic(this,0x37);
          lVar15 = this->_token;
        }
        if (lVar15 == 0x149) {
          bVar14 = true;
        }
        iVar5 = (pCVar9->super_Expr).super_Node._coordinates.lineStart;
        iVar6 = (pCVar9->super_Expr).super_Node._coordinates.columnStart;
        this_00 = this->_astArena;
        pCVar11 = Arena::findChunk(this_00,0x48);
        pCVar4 = (CallExpr *)pCVar11->_ptr;
        pCVar11->_ptr = (uint8_t *)(pCVar4 + 1);
        (pCVar4->super_Expr).super_Node._op = TO_CALL;
        (pCVar4->super_Expr).super_Node._coordinates.lineStart = -1;
        (pCVar4->super_Expr).super_Node._coordinates.columnStart = -1;
        (pCVar4->super_Expr).super_Node._coordinates.lineEnd = -1;
        (pCVar4->super_Expr).super_Node._coordinates.columnEnd = -1;
        (pCVar4->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
             (_func_int **)&PTR__ArenaObj_001a2dd0;
        pCVar4->_callee = &pCVar9->super_Expr;
        (pCVar4->_args)._arena = this_00;
        (pCVar4->_args)._vals = (Expr **)0x0;
        (pCVar4->_args)._size = 0;
        (pCVar4->_args)._allocated = 0;
        pCVar4->_nullable = bVar14;
        if (this->_token == 0x28) {
          checkSuspiciousBracket(this);
        }
        Lex(this);
        lVar15 = this->_token;
        while (lVar15 != 0x29) {
          pEVar10 = Expression(this,SQE_FUNCTION_ARG);
          CallExpr::addArgument(pCVar4,pEVar10);
          lVar15 = this->_token;
          if (lVar15 == 0x2c) {
            Lex(this);
            lVar15 = this->_token;
          }
        }
        (pCVar4->super_Expr).super_Node._coordinates.lineStart = iVar5;
        (pCVar4->super_Expr).super_Node._coordinates.columnStart = iVar6;
        (pCVar4->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
        (pCVar4->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
        Lex(this);
        pCVar9 = pCVar4;
      }
      else {
        if (lVar15 == 0x155) goto LAB_00162378;
        if (lVar15 != 0x156) goto LAB_00162721;
LAB_0016237e:
        bVar14 = true;
LAB_00162381:
        Lex(this);
        if (((this->_lex)._prevflags & 3) != 0) {
          if (lVar15 < 0x155) {
            pcVar12 = ".";
            if (lVar15 != 0x2e) {
              if (lVar15 == 0x146) {
                pcVar12 = "?.";
              }
              else {
LAB_001625cc:
                pcVar12 = "<unknown>";
              }
            }
          }
          else if (lVar15 == 0x155) {
            pcVar12 = ".$";
          }
          else {
            if (lVar15 != 0x156) goto LAB_001625cc;
            pcVar12 = "?.$";
          }
          reportDiagnostic(this,0x35,pcVar12);
        }
        SVar1 = (this->_lex)._currentline;
        SVar2 = (this->_lex)._currentcolumn;
        pEVar10 = Expect(this,0x102);
        ppEVar3 = (Expr **)pEVar10[1].super_Node.super_ArenaObj._vptr_ArenaObj;
        pCVar11 = Arena::findChunk(this->_astArena,0x40);
        pCVar4 = (CallExpr *)pCVar11->_ptr;
        pCVar11->_ptr = &pCVar4->_nullable;
        (pCVar4->super_Expr).super_Node._op = TO_GETFIELD;
        (pCVar4->super_Expr).super_Node._coordinates.lineStart = -1;
        (pCVar4->super_Expr).super_Node._coordinates.columnStart = -1;
        (pCVar4->super_Expr).super_Node._coordinates.lineEnd = -1;
        (pCVar4->super_Expr).super_Node._coordinates.columnEnd = -1;
        pCVar4->_callee = &pCVar9->super_Expr;
        *(bool *)&(pCVar4->_args)._arena = bVar14;
        (pCVar4->_args)._vals = ppEVar3;
        (pCVar4->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
             (_func_int **)&PTR__ArenaObj_001a2e08;
        *(bool *)&(pCVar4->_args)._size = lVar15 - 0x155U < 2;
        iVar5 = (pCVar9->super_Expr).super_Node._coordinates.columnStart;
        (pCVar4->super_Expr).super_Node._coordinates.lineStart =
             (pCVar9->super_Expr).super_Node._coordinates.lineStart;
        (pCVar4->super_Expr).super_Node._coordinates.columnStart = iVar5;
        (pCVar4->super_Expr).super_Node._coordinates.lineEnd = (int)SVar1;
        (pCVar4->super_Expr).super_Node._coordinates.columnEnd = (int)SVar2;
        pCVar9 = pCVar4;
      }
    }
    if (lVar15 < 0x5b) {
      if (lVar15 == 0x28) goto LAB_001623cd;
      if (lVar15 == 0x2e) {
LAB_00162378:
        if (bVar14) goto LAB_0016237e;
        goto LAB_00162381;
      }
      goto LAB_00162721;
    }
    if (lVar15 != 0x5b) {
      if (lVar15 == 0x146) goto LAB_0016237e;
      if ((lVar15 - 0x12fU < 2) && ((this->_lex)._prevtoken != 10)) {
        pCVar11 = Arena::findChunk(this->_astArena,0x30);
        pCVar4 = (CallExpr *)pCVar11->_ptr;
        pCVar11->_ptr = (uint8_t *)&(pCVar4->_args)._vals;
        *(undefined8 *)&(pCVar4->super_Expr).super_Node._op = 0x10000003c;
        (pCVar4->super_Expr).super_Node._coordinates.lineStart = -1;
        (pCVar4->super_Expr).super_Node._coordinates.columnStart = -1;
        (pCVar4->super_Expr).super_Node._coordinates.lineEnd = -1;
        (pCVar4->super_Expr).super_Node._coordinates.columnEnd = -1;
        (pCVar4->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
             (_func_int **)&PTR__ArenaObj_001a2cf0;
        *(uint *)&pCVar4->_callee = ((lVar15 != 0x130) - 1) + (uint)(lVar15 != 0x130);
        (pCVar4->_args)._arena = (Arena *)pCVar9;
        iVar5 = (pCVar9->super_Expr).super_Node._coordinates.columnStart;
        (pCVar4->super_Expr).super_Node._coordinates.lineStart =
             (pCVar9->super_Expr).super_Node._coordinates.lineStart;
        (pCVar4->super_Expr).super_Node._coordinates.columnStart = iVar5;
        (pCVar4->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
        (pCVar4->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
        Lex(this);
        uVar8 = this->_depth;
        pCVar9 = pCVar4;
      }
LAB_00162721:
      this->_depth = uVar8 - iVar13;
      return &pCVar9->super_Expr;
    }
    if (bVar14 != false) goto LAB_0016250f;
LAB_00162512:
    if ((this->_lex)._prevtoken == 10) {
      reportDiagnostic(this,0x1f);
      lVar15 = this->_token;
    }
    if (lVar15 == 0x5b) {
      checkSuspiciousBracket(this);
    }
    Lex(this);
    pEVar10 = Expression(this,SQE_RVALUE);
    pCVar11 = Arena::findChunk(this->_astArena,0x38);
    pCVar4 = (CallExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(pCVar4->_args)._size;
    (pCVar4->super_Expr).super_Node._op = TO_GETSLOT;
    (pCVar4->super_Expr).super_Node._coordinates.lineStart = -1;
    (pCVar4->super_Expr).super_Node._coordinates.columnStart = -1;
    (pCVar4->super_Expr).super_Node._coordinates.lineEnd = -1;
    (pCVar4->super_Expr).super_Node._coordinates.columnEnd = -1;
    pCVar4->_callee = &pCVar9->super_Expr;
    *(bool *)&(pCVar4->_args)._arena = bVar14;
    (pCVar4->_args)._vals = (Expr **)pEVar10;
    (pCVar4->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2e70;
    iVar5 = (pCVar9->super_Expr).super_Node._coordinates.columnStart;
    (pCVar4->super_Expr).super_Node._coordinates.lineStart =
         (pCVar9->super_Expr).super_Node._coordinates.lineStart;
    (pCVar4->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (pCVar4->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pCVar4->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Expect(this,0x5d);
    pCVar9 = pCVar4;
  } while( true );
}

Assistant:

Expr* SQParser::PrefixedExpr()
{
    NestingChecker nc(this);
    //if 'pos' != -1 the previous variable is a local variable
    SQInteger pos;
    Expr *e = Factor(pos);
    bool nextIsNullable = false;
    for(;;) {
        nc.inc();
        switch(_token) {
        case _SC('.'):
        case TK_NULLGETSTR:
        case TK_TYPE_METHOD_GETSTR:
        case TK_NULLABLE_TYPE_METHOD_GETSTR: {
            if (_token == TK_NULLGETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR || nextIsNullable) {
                nextIsNullable = true;
            }

            bool isTypeMethod = _token == TK_TYPE_METHOD_GETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR;

            SQInteger tok = _token;

            Lex();

            if ((_lex._prevflags & (TF_PREP_SPACE | TF_PREP_EOL)) != 0) {
              reportDiagnostic(DiagnosticsId::DI_SPACE_SEP_FIELD_NAME, opname(tok));
            }

            SQInteger l = _lex._currentline, c = _lex._currentcolumn;
            Expr *receiver = e;
            Id *id = (Id *)Expect(TK_IDENTIFIER);
            assert(id);
            e = newNode<GetFieldExpr>(receiver, id->id(), nextIsNullable, isTypeMethod); //-V522
            e->setLineStartPos(receiver->lineStart()); e->setColumnStartPos(receiver->columnStart());
            e->setLineEndPos(l); e->setColumnEndPos(c);
            break;
        }
        case _SC('['):
        case TK_NULLGETOBJ: {
            if (_token == TK_NULLGETOBJ || nextIsNullable)
            {
                nextIsNullable = true;
            }
            if(_lex._prevtoken == _SC('\n'))
                reportDiagnostic(DiagnosticsId::DI_BROKEN_SLOT_DECLARATION);
            if (_token == _SC('['))
              checkSuspiciousBracket();

            Lex();
            Expr *receiver = e;
            Expr *key = Expression(SQE_RVALUE);
            e = setCoordinates(newNode<GetSlotExpr>(receiver, key, nextIsNullable), receiver->lineStart(), receiver->columnStart());
            Expect(_SC(']'));
            break;
        }
        case TK_MINUSMINUS:
        case TK_PLUSPLUS:
            {
                nextIsNullable = false;
                if(IsEndOfStatement()) return e;
                SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                e = setCoordinates(newNode<IncExpr>(e, diff, IF_POSTFIX), e->lineStart(), e->columnStart());
                Lex();
            }
            return e;
        case _SC('('):
        case TK_NULLCALL: {
            if (_lex._prevflags & TF_PREP_EOL && _token == _SC('(')) {
                reportDiagnostic(DiagnosticsId::DI_PAREN_IS_FUNC_CALL);
            }
            SQInteger nullcall = (_token==TK_NULLCALL || nextIsNullable);
            nextIsNullable = !!nullcall;
            SQInteger l = e->lineStart(), c = e->columnStart();
            CallExpr *call = newNode<CallExpr>(arena(), e, nullcall);

            if (_token == _SC('('))
              checkSuspiciousBracket();

            Lex();
            while (_token != _SC(')')) {
                call->addArgument(Expression(SQE_FUNCTION_ARG));
                if (_token == _SC(',')) {
                    Lex();
                }
            }

            setCoordinates(call, l, c);

            Lex();
            e = call;
            break;
        }
        default: return e;
        }
    }
}